

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O1

void __thiscall Markov::Connection::TrainFinal(Connection *this,string_view src,TrainData *td)

{
  bool bVar1;
  undefined8 uVar2;
  sviterator iter;
  bool local_151;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_140;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_b8;
  
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  regex_token_iterator(&local_140,src._M_str,src._M_str + src._M_len,&td->iter,0,0);
  while( true ) {
    bVar1 = std::__cxx11::
            regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator==
                      (&local_140,&td->badIter);
    if (bVar1) {
      if (local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_140._M_position._M_match.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_140._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_140._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    local_150._M_str = ((local_140._M_result)->super_pair<const_char_*,_const_char_*>).first;
    local_150._M_len =
         (size_t)(((local_140._M_result)->super_pair<const_char_*,_const_char_*>).second +
                 -(long)local_150._M_str);
    if (((local_140._M_result)->matched & 1U) == 0) {
      local_150._M_str = (char *)0x0;
      local_150._M_len = (size_t)(char *)0x0;
    }
    local_151 = false;
    if ((td->func).super__Function_base._M_manager == (_Manager_type)0x0) break;
    (*(td->func)._M_invoker)((_Any_data *)&td->func,&local_150,&local_151);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    operator++(&local_b8,&local_140,0);
    if (local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8._M_position._M_match.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  uVar2 = std::__throw_bad_function_call();
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  ~regex_token_iterator(&local_140);
  _Unwind_Resume(uVar2);
}

Assistant:

void Connection::TrainFinal(std::string_view src, const TrainData& td) {
		for (auto iter = sviterator(src.begin(), src.end(), td.iter); iter != td.badIter; iter++) {
				td.func(matchToSv(*iter), false);
				}
		}